

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  sqvector<char,_unsigned_int> *this_00;
  int iVar1;
  ulong in_RAX;
  SQInteger SVar2;
  byte bVar3;
  undefined8 uStack_28;
  
  this_00 = &this->_longstr;
  uStack_28 = in_RAX & 0xffffffffffffff;
  sqvector<char,_unsigned_int>::resize(this_00,0,(char *)((long)&uStack_28 + 7));
  bVar3 = this->_currdata;
  do {
    do {
      uStack_28._0_6_ = CONCAT15(bVar3,(undefined5)uStack_28);
      sqvector<char,_unsigned_int>::push_back(this_00,(char *)((long)&uStack_28 + 5));
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      bVar3 = this->_currdata;
      iVar1 = isalnum((uint)bVar3);
    } while (bVar3 == 0x5f);
  } while (iVar1 != 0);
  uStack_28._0_7_ = (uint7)(uint6)uStack_28;
  sqvector<char,_unsigned_int>::push_back(this_00,(char *)((long)&uStack_28 + 6));
  SVar2 = GetIDType(this,(this->_longstr)._vals,(ulong)((this->_longstr)._size - 1));
  if ((SVar2 == 0x136) || (SVar2 == 0x102)) {
    this->_svalue = (this->_longstr)._vals;
  }
  return SVar2;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(isalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        SetStringValue();
    }
    return res;
}